

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O0

ostream * absl::lts_20250127::operator<<(ostream *os,uint128 v)

{
  uint128 lhs;
  long lVar1;
  ulong uVar2;
  bool bVar3;
  _Ios_Fmtflags _Var4;
  ulong uVar5;
  ulong uVar6;
  ostream *poVar7;
  void *this;
  fmtflags in_R8D;
  uint128 v_00;
  uint128 local_a8;
  void *local_98;
  uint64_t uStack_90;
  _Ios_Fmtflags local_7c;
  long lStack_78;
  fmtflags adjustfield;
  size_t count;
  ulong local_60;
  streamsize width;
  uint64_t uStack_50;
  undefined1 local_48 [8];
  string rep;
  fmtflags flags;
  ostream *os_local;
  uint128 v_local;
  
  v_00.lo_ = v.hi_;
  this = (void *)v.lo_;
  rep.field_2._12_4_ = std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)));
  v_00.hi_._0_4_ = rep.field_2._12_4_;
  v_00.hi_._4_4_ = 0;
  width = (streamsize)this;
  uStack_50 = v_00.lo_;
  (anonymous_namespace)::Uint128ToFormattedString_abi_cxx11_((string *)local_48,this,v_00,in_R8D);
  uVar5 = std::ios_base::width((ios_base *)(os + *(long *)(*(long *)os + -0x18)),0);
  local_60 = uVar5;
  uVar6 = std::__cxx11::string::size();
  uVar2 = local_60;
  if (uVar6 < uVar5) {
    lStack_78 = std::__cxx11::string::size();
    lStack_78 = uVar2 - lStack_78;
    local_7c = std::operator&(rep.field_2._12_4_,_S_adjustfield);
    lVar1 = lStack_78;
    if (local_7c == _S_left) {
      std::ios::fill();
      std::__cxx11::string::append((ulong)local_48,(char)lVar1);
    }
    else {
      if (((local_7c == _S_internal) &&
          (_Var4 = std::operator&(rep.field_2._12_4_,_S_showbase),
          _Var4 != ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max))) &&
         (_Var4 = std::operator&(rep.field_2._12_4_,_S_basefield), _Var4 == _S_hex)) {
        local_98 = this;
        uStack_90 = v_00.lo_;
        uint128::uint128(&local_a8,0);
        lhs.hi_ = uStack_90;
        lhs.lo_ = (uint64_t)local_98;
        bVar3 = operator!=(lhs,local_a8);
        lVar1 = lStack_78;
        if (bVar3) {
          std::ios::fill();
          std::__cxx11::string::insert((ulong)local_48,2,(char)lVar1);
          goto LAB_0059b6d9;
        }
      }
      lVar1 = lStack_78;
      std::ios::fill();
      std::__cxx11::string::insert((ulong)local_48,0,(char)lVar1);
    }
  }
LAB_0059b6d9:
  poVar7 = std::operator<<(os,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  return poVar7;
}

Assistant:

std::ostream& operator<<(std::ostream& os, uint128 v) {
  std::ios_base::fmtflags flags = os.flags();
  std::string rep = Uint128ToFormattedString(v, flags);

  // Add the requisite padding.
  std::streamsize width = os.width(0);
  if (static_cast<size_t>(width) > rep.size()) {
    const size_t count = static_cast<size_t>(width) - rep.size();
    std::ios::fmtflags adjustfield = flags & std::ios::adjustfield;
    if (adjustfield == std::ios::left) {
      rep.append(count, os.fill());
    } else if (adjustfield == std::ios::internal &&
               (flags & std::ios::showbase) &&
               (flags & std::ios::basefield) == std::ios::hex && v != 0) {
      rep.insert(size_t{2}, count, os.fill());
    } else {
      rep.insert(size_t{0}, count, os.fill());
    }
  }

  return os << rep;
}